

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

int BuildMapUaToAa(TIFFRGBAImage *img)

{
  uint8_t *puVar1;
  char cVar2;
  char cVar10;
  short sVar18;
  ushort uVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  int aaiVar33 [2] [2];
  undefined1 auVar34 [16];
  uint8_t *puVar35;
  uint uVar36;
  long lVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  short sVar42;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int aaiVar51 [2] [2];
  int aaiVar52 [2] [2];
  int iVar55;
  undefined1 auVar53 [16];
  int iVar56;
  undefined1 auVar54 [16];
  int iVar59;
  undefined1 auVar57 [16];
  int iVar60;
  undefined1 auVar58 [16];
  int iVar63;
  undefined1 auVar61 [16];
  int iVar64;
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  short sVar67;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  undefined4 uVar43;
  undefined6 uVar44;
  undefined8 uVar45;
  undefined1 auVar46 [12];
  undefined1 auVar47 [14];
  undefined1 auVar50 [16];
  undefined4 uVar68;
  undefined6 uVar69;
  undefined8 uVar70;
  undefined1 auVar71 [12];
  undefined1 auVar72 [14];
  undefined1 auVar76 [16];
  
  if (img->UaToAa == (uint8_t *)0x0) {
    puVar35 = (uint8_t *)_TIFFmallocExt(img->tif,0x10000);
    img->UaToAa = puVar35;
    auVar34 = _DAT_0032fb70;
    aaiVar33 = jpeg_zigzag_order2;
    if (puVar35 == (uint8_t *)0x0) {
      iVar55 = 0;
      TIFFErrorExtR(img->tif,"BuildMapUaToAa","Out of memory");
    }
    else {
      uVar36 = 0;
      do {
        lVar37 = 0;
        aaiVar51 = aaiVar33;
        auVar53 = _DAT_0032fb40;
        auVar57 = _DAT_0032fb30;
        auVar61 = _DAT_0032fb20;
        do {
          iVar63 = auVar61._4_4_;
          iVar64 = auVar61._12_4_;
          auVar38._4_4_ = iVar63;
          auVar38._0_4_ = iVar63;
          auVar38._8_4_ = iVar64;
          auVar38._12_4_ = iVar64;
          iVar59 = auVar57._4_4_;
          iVar60 = auVar57._12_4_;
          auVar39._4_4_ = iVar59;
          auVar39._0_4_ = iVar59;
          auVar39._8_4_ = iVar60;
          auVar39._12_4_ = iVar60;
          iVar55 = auVar53._4_4_;
          iVar56 = auVar53._12_4_;
          auVar73._4_4_ = iVar55;
          auVar73._0_4_ = iVar55;
          auVar73._8_4_ = iVar56;
          auVar73._12_4_ = iVar56;
          auVar74._0_4_ = aaiVar51[0][0] * uVar36 + 0x7f;
          auVar74._4_4_ = aaiVar51[0][1] * uVar36 + 0x7f;
          auVar74._8_4_ = (int)(((ulong)aaiVar51[1] & 0xffffffff) * (ulong)uVar36) + 0x7f;
          auVar74._12_4_ = aaiVar51[1][1] * uVar36 + 0x7f;
          auVar40._0_4_ = auVar53._0_4_ * uVar36 + 0x7f;
          auVar40._4_4_ = iVar55 * uVar36 + 0x7f;
          auVar40._8_4_ = (int)((auVar53._8_8_ & 0xffffffff) * (ulong)uVar36) + 0x7f;
          auVar40._12_4_ = (int)((auVar73._8_8_ & 0xffffffff) * (ulong)uVar36) + 0x7f;
          auVar48._0_4_ = auVar57._0_4_ * uVar36 + 0x7f;
          auVar48._4_4_ = iVar59 * uVar36 + 0x7f;
          auVar48._8_4_ = (int)((auVar57._8_8_ & 0xffffffff) * (ulong)uVar36) + 0x7f;
          auVar48._12_4_ = (int)((auVar39._8_8_ & 0xffffffff) * (ulong)uVar36) + 0x7f;
          auVar65._0_4_ = auVar61._0_4_ * uVar36 + 0x7f;
          auVar65._4_4_ = iVar63 * uVar36 + 0x7f;
          auVar65._8_4_ = (int)((auVar61._8_8_ & 0xffffffff) * (ulong)uVar36) + 0x7f;
          auVar65._12_4_ = (int)((auVar38._8_8_ & 0xffffffff) * (ulong)uVar36) + 0x7f;
          auVar66._0_4_ = auVar65._0_4_ / 0xff;
          auVar66._4_4_ = auVar65._4_4_ / 0xff;
          auVar66._8_4_ = (undefined4)((auVar65._8_8_ & 0xffffffff) / 0xff);
          auVar66._12_4_ = auVar65._12_4_ / 0xff;
          auVar49._0_4_ = auVar48._0_4_ / 0xff;
          auVar49._4_4_ = auVar48._4_4_ / 0xff;
          auVar49._8_4_ = (undefined4)((auVar48._8_8_ & 0xffffffff) / 0xff);
          auVar49._12_4_ = auVar48._12_4_ / 0xff;
          auVar41._0_4_ = auVar40._0_4_ / 0xff;
          auVar41._4_4_ = auVar40._4_4_ / 0xff;
          auVar41._8_4_ = (undefined4)((auVar40._8_8_ & 0xffffffff) / 0xff);
          auVar41._12_4_ = auVar40._12_4_ / 0xff;
          auVar75._0_4_ = auVar74._0_4_ / 0xff;
          auVar75._4_4_ = auVar74._4_4_ / 0xff;
          auVar75._8_4_ = (undefined4)((auVar74._8_8_ & 0xffffffff) / 0xff);
          auVar75._12_4_ = auVar74._12_4_ / 0xff;
          auVar75 = auVar75 & auVar34;
          auVar41 = auVar41 & auVar34;
          sVar18 = auVar75._0_2_;
          cVar2 = (0 < sVar18) * (sVar18 < 0x100) * auVar75[0] - (0xff < sVar18);
          uVar19 = auVar75._2_2_;
          sVar67 = CONCAT11((uVar19 != 0) * (uVar19 < 0x100) * auVar75[2] - (0xff < uVar19),cVar2);
          sVar18 = auVar75._4_2_;
          cVar3 = (0 < sVar18) * (sVar18 < 0x100) * auVar75[4] - (0xff < sVar18);
          uVar19 = auVar75._6_2_;
          uVar68 = CONCAT13((uVar19 != 0) * (uVar19 < 0x100) * auVar75[6] - (0xff < uVar19),
                            CONCAT12(cVar3,sVar67));
          sVar18 = auVar75._8_2_;
          cVar4 = (0 < sVar18) * (sVar18 < 0x100) * auVar75[8] - (0xff < sVar18);
          sVar18 = auVar75._10_2_;
          uVar69 = CONCAT15((0 < sVar18) * (sVar18 < 0x100) * auVar75[10] - (0xff < sVar18),
                            CONCAT14(cVar4,uVar68));
          sVar18 = auVar75._12_2_;
          cVar5 = (0 < sVar18) * (sVar18 < 0x100) * auVar75[0xc] - (0xff < sVar18);
          sVar18 = auVar75._14_2_;
          uVar70 = CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar75[0xe] - (0xff < sVar18),
                            CONCAT16(cVar5,uVar69));
          sVar18 = auVar41._0_2_;
          cVar6 = (0 < sVar18) * (sVar18 < 0x100) * auVar41[0] - (0xff < sVar18);
          uVar19 = auVar41._2_2_;
          auVar71._0_10_ =
               CONCAT19((uVar19 != 0) * (uVar19 < 0x100) * auVar41[2] - (0xff < uVar19),
                        CONCAT18(cVar6,uVar70));
          sVar18 = auVar41._4_2_;
          cVar7 = (0 < sVar18) * (sVar18 < 0x100) * auVar41[4] - (0xff < sVar18);
          auVar71[10] = cVar7;
          uVar19 = auVar41._6_2_;
          auVar71[0xb] = (uVar19 != 0) * (uVar19 < 0x100) * auVar41[6] - (0xff < uVar19);
          sVar18 = auVar41._8_2_;
          cVar8 = (0 < sVar18) * (sVar18 < 0x100) * auVar41[8] - (0xff < sVar18);
          auVar72[0xc] = cVar8;
          auVar72._0_12_ = auVar71;
          sVar18 = auVar41._10_2_;
          auVar72[0xd] = (0 < sVar18) * (sVar18 < 0x100) * auVar41[10] - (0xff < sVar18);
          sVar18 = auVar41._12_2_;
          cVar9 = (0 < sVar18) * (sVar18 < 0x100) * auVar41[0xc] - (0xff < sVar18);
          auVar76[0xe] = cVar9;
          auVar76._0_14_ = auVar72;
          sVar18 = auVar41._14_2_;
          auVar76[0xf] = (0 < sVar18) * (sVar18 < 0x100) * auVar41[0xe] - (0xff < sVar18);
          auVar49 = auVar49 & auVar34;
          auVar66 = auVar66 & auVar34;
          sVar18 = auVar49._0_2_;
          cVar10 = (0 < sVar18) * (sVar18 < 0x100) * auVar49[0] - (0xff < sVar18);
          uVar19 = auVar49._2_2_;
          sVar42 = CONCAT11((uVar19 != 0) * (uVar19 < 0x100) * auVar49[2] - (0xff < uVar19),cVar10);
          sVar18 = auVar49._4_2_;
          cVar11 = (0 < sVar18) * (sVar18 < 0x100) * auVar49[4] - (0xff < sVar18);
          uVar19 = auVar49._6_2_;
          uVar43 = CONCAT13((uVar19 != 0) * (uVar19 < 0x100) * auVar49[6] - (0xff < uVar19),
                            CONCAT12(cVar11,sVar42));
          sVar18 = auVar49._8_2_;
          cVar12 = (0 < sVar18) * (sVar18 < 0x100) * auVar49[8] - (0xff < sVar18);
          sVar18 = auVar49._10_2_;
          uVar44 = CONCAT15((0 < sVar18) * (sVar18 < 0x100) * auVar49[10] - (0xff < sVar18),
                            CONCAT14(cVar12,uVar43));
          sVar18 = auVar49._12_2_;
          cVar13 = (0 < sVar18) * (sVar18 < 0x100) * auVar49[0xc] - (0xff < sVar18);
          sVar18 = auVar49._14_2_;
          uVar45 = CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar49[0xe] - (0xff < sVar18),
                            CONCAT16(cVar13,uVar44));
          sVar18 = auVar66._0_2_;
          cVar14 = (0 < sVar18) * (sVar18 < 0x100) * auVar66[0] - (0xff < sVar18);
          uVar19 = auVar66._2_2_;
          auVar46._0_10_ =
               CONCAT19((uVar19 != 0) * (uVar19 < 0x100) * auVar66[2] - (0xff < uVar19),
                        CONCAT18(cVar14,uVar45));
          sVar18 = auVar66._4_2_;
          cVar15 = (0 < sVar18) * (sVar18 < 0x100) * auVar66[4] - (0xff < sVar18);
          auVar46[10] = cVar15;
          uVar19 = auVar66._6_2_;
          auVar46[0xb] = (uVar19 != 0) * (uVar19 < 0x100) * auVar66[6] - (0xff < uVar19);
          sVar18 = auVar66._8_2_;
          cVar16 = (0 < sVar18) * (sVar18 < 0x100) * auVar66[8] - (0xff < sVar18);
          auVar47[0xc] = cVar16;
          auVar47._0_12_ = auVar46;
          sVar18 = auVar66._10_2_;
          auVar47[0xd] = (0 < sVar18) * (sVar18 < 0x100) * auVar66[10] - (0xff < sVar18);
          sVar18 = auVar66._12_2_;
          cVar17 = (0 < sVar18) * (sVar18 < 0x100) * auVar66[0xc] - (0xff < sVar18);
          auVar50[0xe] = cVar17;
          auVar50._0_14_ = auVar47;
          sVar18 = auVar66._14_2_;
          auVar50[0xf] = (0 < sVar18) * (sVar18 < 0x100) * auVar66[0xe] - (0xff < sVar18);
          sVar18 = (short)((uint)uVar68 >> 0x10);
          sVar20 = (short)((uint6)uVar69 >> 0x20);
          sVar21 = (short)((ulong)uVar70 >> 0x30);
          sVar22 = (short)((unkuint10)auVar71._0_10_ >> 0x40);
          sVar23 = auVar71._10_2_;
          sVar24 = auVar72._12_2_;
          sVar25 = auVar76._14_2_;
          sVar26 = (short)((uint)uVar43 >> 0x10);
          sVar27 = (short)((uint6)uVar44 >> 0x20);
          sVar28 = (short)((ulong)uVar45 >> 0x30);
          sVar29 = (short)((unkuint10)auVar46._0_10_ >> 0x40);
          sVar30 = auVar46._10_2_;
          sVar31 = auVar47._12_2_;
          sVar32 = auVar50._14_2_;
          puVar1 = puVar35 + lVar37;
          *puVar1 = (0 < sVar67) * (sVar67 < 0x100) * cVar2 - (0xff < sVar67);
          puVar1[1] = (0 < sVar18) * (sVar18 < 0x100) * cVar3 - (0xff < sVar18);
          puVar1[2] = (0 < sVar20) * (sVar20 < 0x100) * cVar4 - (0xff < sVar20);
          puVar1[3] = (0 < sVar21) * (sVar21 < 0x100) * cVar5 - (0xff < sVar21);
          puVar1[4] = (0 < sVar22) * (sVar22 < 0x100) * cVar6 - (0xff < sVar22);
          puVar1[5] = (0 < sVar23) * (sVar23 < 0x100) * cVar7 - (0xff < sVar23);
          puVar1[6] = (0 < sVar24) * (sVar24 < 0x100) * cVar8 - (0xff < sVar24);
          puVar1[7] = (0 < sVar25) * (sVar25 < 0x100) * cVar9 - (0xff < sVar25);
          puVar1[8] = (0 < sVar42) * (sVar42 < 0x100) * cVar10 - (0xff < sVar42);
          puVar1[9] = (0 < sVar26) * (sVar26 < 0x100) * cVar11 - (0xff < sVar26);
          puVar1[10] = (0 < sVar27) * (sVar27 < 0x100) * cVar12 - (0xff < sVar27);
          puVar1[0xb] = (0 < sVar28) * (sVar28 < 0x100) * cVar13 - (0xff < sVar28);
          puVar1[0xc] = (0 < sVar29) * (sVar29 < 0x100) * cVar14 - (0xff < sVar29);
          puVar1[0xd] = (0 < sVar30) * (sVar30 < 0x100) * cVar15 - (0xff < sVar30);
          puVar1[0xe] = (0 < sVar31) * (sVar31 < 0x100) * cVar16 - (0xff < sVar31);
          puVar1[0xf] = (0 < sVar32) * (sVar32 < 0x100) * cVar17 - (0xff < sVar32);
          lVar37 = lVar37 + 0x10;
          aaiVar52[0][0] = aaiVar51[0][0] + 0x10;
          aaiVar52[0][1] = aaiVar51[0][1] + 0x10;
          aaiVar52[1][0] = aaiVar51[1][0] + 0x10;
          aaiVar52[1][1] = aaiVar51[1][1] + 0x10;
          auVar54._0_4_ = auVar53._0_4_ + 0x10;
          auVar54._4_4_ = iVar55 + 0x10;
          auVar54._8_4_ = auVar53._8_4_ + 0x10;
          auVar54._12_4_ = iVar56 + 0x10;
          auVar58._0_4_ = auVar57._0_4_ + 0x10;
          auVar58._4_4_ = iVar59 + 0x10;
          auVar58._8_4_ = auVar57._8_4_ + 0x10;
          auVar58._12_4_ = iVar60 + 0x10;
          auVar62._0_4_ = auVar61._0_4_ + 0x10;
          auVar62._4_4_ = iVar63 + 0x10;
          auVar62._8_4_ = auVar61._8_4_ + 0x10;
          auVar62._12_4_ = iVar64 + 0x10;
          aaiVar51 = aaiVar52;
          auVar53 = auVar54;
          auVar57 = auVar58;
          auVar61 = auVar62;
        } while (lVar37 != 0x100);
        uVar36 = uVar36 + 1;
        puVar35 = puVar35 + 0x100;
      } while (uVar36 != 0x100);
      iVar55 = 1;
    }
    return iVar55;
  }
  __assert_fail("img->UaToAa == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_getimage.c"
                ,0xc50,"int BuildMapUaToAa(TIFFRGBAImage *)");
}

Assistant:

static int BuildMapUaToAa(TIFFRGBAImage *img)
{
    static const char module[] = "BuildMapUaToAa";
    uint8_t *m;
    uint16_t na, nv;
    assert(img->UaToAa == NULL);
    img->UaToAa = _TIFFmallocExt(img->tif, 65536);
    if (img->UaToAa == NULL)
    {
        TIFFErrorExtR(img->tif, module, "Out of memory");
        return (0);
    }
    m = img->UaToAa;
    for (na = 0; na < 256; na++)
    {
        for (nv = 0; nv < 256; nv++)
            *m++ = (uint8_t)((nv * na + 127) / 255);
    }
    return (1);
}